

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion.cc
# Opt level: O1

double __thiscall
FIX::double_conversion::StringToDoubleConverter::StringToIeee<char_const*>
          (StringToDoubleConverter *this,char *input,int length,bool read_as_double,
          int *processed_characters_count)

{
  double_conversion dVar1;
  double dVar2;
  int *piVar3;
  int iVar4;
  bool bVar5;
  bool bVar6;
  double_conversion dVar7;
  int iVar8;
  undefined7 in_register_00000009;
  int iVar9;
  int iVar10;
  ulong uVar11;
  double_conversion *pdVar12;
  long lVar13;
  double_conversion *pdVar14;
  double_conversion *pdVar15;
  long lVar16;
  uint uVar17;
  double_conversion *pdVar18;
  long lVar19;
  byte bVar20;
  uint uVar21;
  char cVar22;
  undefined4 in_XMM0_Da;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  float fVar23;
  undefined4 in_XMM0_Db;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  Vector<const_char> buffer_00;
  Vector<const_char> buffer_01;
  bool result_is_junk_1;
  char *start;
  char buffer [782];
  double_conversion *local_3b0;
  uint local_3a4;
  int *local_3a0;
  double_conversion *local_398;
  char *local_390;
  double_conversion *local_388;
  bool local_379;
  double_conversion *local_378;
  ulong local_370;
  undefined1 local_368 [16];
  double_conversion *local_358;
  double_conversion *local_350;
  double_conversion local_348 [792];
  
  *processed_characters_count = 0;
  if (length == 0) {
LAB_0016b7c0:
    return this->empty_string_value_;
  }
  local_368._0_4_ = (int)CONCAT71(in_register_00000009,read_as_double);
  lVar13 = (long)length;
  local_398 = (double_conversion *)(input + lVar13);
  uVar21 = this->flags_;
  local_3b0 = (double_conversion *)input;
  if ((uVar21 & 0x18) != 0) {
    bVar5 = isWhitespace((int)*input);
    in_XMM0_Da = extraout_XMM0_Da;
    in_XMM0_Db = extraout_XMM0_Db;
    if (bVar5) {
      local_3a0 = (int *)CONCAT44(local_3a0._4_4_,uVar21);
      pdVar18 = (double_conversion *)input;
      do {
        lVar13 = lVar13 + -1;
        if (lVar13 == 0) {
          local_3b0 = local_398;
          goto LAB_0016b7b6;
        }
        pdVar18 = pdVar18 + 1;
        bVar5 = isWhitespace((int)(char)*pdVar18);
      } while (bVar5);
      in_XMM0_Da = extraout_XMM0_Da_00;
      in_XMM0_Db = extraout_XMM0_Db_00;
      uVar21 = (uint)local_3a0;
      local_3b0 = pdVar18;
      if (lVar13 == 0) {
LAB_0016b7b6:
        *processed_characters_count = (int)local_3b0 - (int)input;
        goto LAB_0016b7c0;
      }
    }
    if (((uVar21 & 8) == 0) && (local_3b0 != (double_conversion *)input)) goto LAB_0016bf8b;
  }
  pdVar18 = local_3b0;
  dVar1 = *local_3b0;
  bVar20 = (byte)uVar21;
  local_3a0 = processed_characters_count;
  local_390 = input;
  if ((dVar1 == (double_conversion)0x2d) || (dVar1 == (double_conversion)0x2b)) {
    local_3a4 = (uint)(dVar1 == (double_conversion)0x2d);
    pdVar15 = local_3b0 + 1;
    bVar5 = pdVar15 != local_398;
    lVar13 = 1;
    if ((bVar5) &&
       (pdVar14 = local_3b0 + 1, local_3b0 = pdVar15, bVar6 = isWhitespace((int)(char)*pdVar14),
       in_XMM0_Da = extraout_XMM0_Da_01, in_XMM0_Db = extraout_XMM0_Db_01, pdVar15 = local_3b0,
       bVar6)) {
      lVar16 = (long)local_398 - (long)pdVar18;
      lVar19 = 2;
      do {
        bVar5 = pdVar18 + lVar19 != local_398;
        lVar13 = lVar16;
        pdVar15 = local_3b0;
        if (pdVar18 + lVar19 == local_398) break;
        bVar6 = isWhitespace((int)(char)pdVar18[lVar19]);
        lVar13 = lVar19;
        lVar19 = lVar19 + 1;
        in_XMM0_Da = extraout_XMM0_Da_02;
        in_XMM0_Db = extraout_XMM0_Db_02;
        pdVar15 = local_3b0;
      } while (bVar6);
    }
    local_3b0 = pdVar15;
    if ((bVar5) && (((uVar21 & 0x20) != 0 || (lVar13 == 1)))) {
      local_3b0 = pdVar18 + lVar13;
      bVar5 = true;
    }
    else {
      in_XMM0_Da = SUB84(this->junk_string_value_,0);
      in_XMM0_Db = (undefined4)((ulong)this->junk_string_value_ >> 0x20);
      bVar5 = false;
    }
    if (!bVar5) {
      return (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
    }
  }
  else {
    local_3a4 = 0;
  }
  pdVar15 = local_398;
  piVar3 = local_3a0;
  pdVar18 = (double_conversion *)this->infinity_symbol_;
  if ((pdVar18 != (double_conversion *)0x0) && (*local_3b0 == *pdVar18)) {
    bVar5 = ConsumeSubString<char_const*>((char **)&local_3b0,(char *)local_398,(char *)pdVar18);
    pdVar18 = local_3b0;
    if ((bVar5) && (local_3b0 == pdVar15 || (uVar21 & 0x14) != 0)) {
      if ((uVar21 & 4) == 0) {
        bVar5 = local_3b0 != pdVar15;
        if ((bVar5) && (bVar6 = isWhitespace((int)(char)*local_3b0), bVar6)) {
          do {
            pdVar18 = pdVar18 + 1;
            bVar5 = pdVar18 != local_398;
            if (pdVar18 == local_398) break;
            bVar6 = isWhitespace((int)(char)*pdVar18);
          } while (bVar6);
        }
        local_3b0 = pdVar18;
        if (bVar5) goto LAB_0016bf8b;
      }
      *local_3a0 = (int)local_3b0 - (int)local_390;
      if ((char)local_3a4 == '\0') {
        return INFINITY;
      }
      return -INFINITY;
    }
    goto LAB_0016bf8b;
  }
  pdVar18 = (double_conversion *)this->nan_symbol_;
  if ((pdVar18 != (double_conversion *)0x0) && (*local_3b0 == *pdVar18)) {
    bVar5 = ConsumeSubString<char_const*>((char **)&local_3b0,(char *)local_398,(char *)pdVar18);
    pdVar18 = local_3b0;
    if ((bVar5) && (local_3b0 == pdVar15 || (uVar21 & 0x14) != 0)) {
      if ((uVar21 & 4) == 0) {
        bVar5 = local_3b0 != pdVar15;
        if ((bVar5) && (bVar6 = isWhitespace((int)(char)*local_3b0), bVar6)) {
          do {
            pdVar18 = pdVar18 + 1;
            bVar5 = pdVar18 != local_398;
            if (pdVar18 == local_398) break;
            bVar6 = isWhitespace((int)(char)*pdVar18);
          } while (bVar6);
        }
        local_3b0 = pdVar18;
        if (bVar5) goto LAB_0016bf8b;
      }
      *local_3a0 = (int)local_3b0 - (int)local_390;
      if ((char)local_3a4 == '\0') {
        return NAN;
      }
      return -NAN;
    }
    goto LAB_0016bf8b;
  }
  dVar1 = *local_3b0;
  pdVar18 = (double_conversion *)0x0;
  pdVar14 = (double_conversion *)0x0;
  if (dVar1 == (double_conversion)0x30) {
    pdVar12 = local_3b0 + 1;
    if (pdVar12 == local_398) {
      *local_3a0 = (int)pdVar12 - (int)local_390;
    }
    else {
      if (((uVar21 & 1) != 0) && (((byte)*pdVar12 | 0x20) == 0x78)) {
        local_3b0 = local_3b0 + 2;
        if ((local_3b0 != local_398) &&
           ((dVar1 = *local_3b0, (char)dVar1 < 0x40 && (int)(char)dVar1 - 0x30U < 10 ||
            (((byte)dVar1 - 0x41 < 0x26 &&
             ((0x3f0000003fU >> ((ulong)((byte)dVar1 - 0x41) & 0x3f) & 1) != 0)))))) {
          local_368._0_8_ =
               RadixStringToIeee<4,char_const*>
                         ((char **)&local_3b0,(char *)local_398,(bool)(char)local_3a4,
                          SUB41((uVar21 & 4) >> 2,0),this->junk_string_value_,local_368[0],
                          (bool *)local_348);
          pdVar18 = local_3b0;
          if (local_348[0] != (double_conversion)0x0) {
            return (double)local_368._0_8_;
          }
          if (local_3b0 != pdVar15 && (uVar21 & 0x10) != 0) {
            local_368._8_4_ = extraout_XMM0_Dc;
            local_368._12_4_ = extraout_XMM0_Dd;
            bVar5 = isWhitespace((int)(char)*local_3b0);
            if (bVar5) {
              do {
                pdVar18 = pdVar18 + 1;
                if (pdVar18 == local_398) break;
                bVar5 = isWhitespace((int)(char)*pdVar18);
              } while (bVar5);
            }
          }
          local_3b0 = pdVar18;
          *piVar3 = (int)local_3b0 - (int)local_390;
          return (double)local_368._0_8_;
        }
        goto LAB_0016bf8b;
      }
      iVar9 = (int)pdVar12 - (int)local_390;
      do {
        if (*pdVar12 != (double_conversion)0x30) {
          pdVar14 = (double_conversion *)(ulong)(bVar20 >> 1);
          local_3b0 = pdVar12;
          goto LAB_0016b98b;
        }
        pdVar12 = pdVar12 + 1;
        iVar9 = iVar9 + 1;
      } while (pdVar12 != local_398);
      *local_3a0 = iVar9;
    }
LAB_0016bcf4:
    if ((bool)(char)local_3a4 == false) {
      return 0.0;
    }
    return -0.0;
  }
LAB_0016b98b:
  iVar9 = 0;
  bVar5 = false;
  uVar17 = 0;
  do {
    dVar7 = *local_3b0;
    iVar8 = (int)pdVar18;
    if (9 < (byte)((char)dVar7 - 0x30U)) {
      if (iVar8 == 0) {
        pdVar14 = pdVar18;
      }
      uVar11 = 0;
      if (dVar7 != (double_conversion)0x2e) goto LAB_0016bd8f;
      if (((~(byte)pdVar14 | bVar20 >> 2) & 1) == 0) goto LAB_0016bf8b;
      uVar11 = 0;
      pdVar15 = local_3b0;
      if (((ulong)pdVar14 & 1) != 0) goto LAB_0016ba01;
      pdVar15 = local_3b0 + 1;
      if (pdVar15 == local_398) {
        if ((iVar8 != 0) || (dVar1 == (double_conversion)0x30)) goto LAB_0016ba01;
        goto LAB_0016bf8b;
      }
      uVar11 = 0;
      local_3b0 = pdVar15;
      if ((iVar8 != 0) || (uVar11 = 0, *pdVar15 != (double_conversion)0x30)) goto LAB_0016bc19;
      uVar11 = 0;
      goto LAB_0016bbf2;
    }
    if (iVar8 < 0x304) {
      if (0x30d < (int)uVar17) {
        __assert_fail("buffer_pos < kBufferSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                      ,0x319,
                      "double FIX::double_conversion::StringToDoubleConverter::StringToIeee(Iterator, int, bool, int *) const [Iterator = const char *]"
                     );
      }
      lVar13 = (long)(int)uVar17;
      uVar17 = uVar17 + 1;
      local_348[lVar13] = dVar7;
      pdVar18 = (double_conversion *)(ulong)(iVar8 + 1);
    }
    else {
      iVar9 = iVar9 + 1;
      bVar5 = (bool)(dVar7 != (double_conversion)0x30 | bVar5);
    }
    if (((ulong)pdVar14 & 1) == 0) {
      pdVar14 = (double_conversion *)0x0;
    }
    else {
      pdVar14 = (double_conversion *)(ulong)((char)*local_3b0 < '8');
    }
    local_3b0 = local_3b0 + 1;
  } while (local_3b0 != local_398);
  uVar11 = 0;
  pdVar15 = local_3b0;
  goto LAB_0016ba01;
LAB_0016bd8f:
  iVar10 = (int)uVar11;
  if ((iVar8 == 0 && iVar10 == 0) && dVar1 != (double_conversion)0x30) goto LAB_0016bf8b;
  pdVar18 = local_3b0;
  if (((byte)*local_3b0 | 0x20) == 0x65) {
    if (((~(byte)pdVar14 | bVar20 >> 2) & 1) == 0) goto LAB_0016bf8b;
    pdVar15 = local_3b0;
    if (((ulong)pdVar14 & 1) == 0) {
      pdVar15 = local_3b0 + 1;
      if (pdVar15 == local_398) {
        if ((uVar21 & 4) == 0) goto LAB_0016bf8b;
      }
      else {
        dVar1 = *pdVar15;
        if ((((dVar1 == (double_conversion)0x2d) ||
             (dVar7 = (double_conversion)0x2b, dVar1 == (double_conversion)0x2b)) &&
            (local_3b0 = local_3b0 + 2, pdVar18 = local_3b0, pdVar15 = local_3b0, dVar7 = dVar1,
            local_3b0 == local_398)) ||
           ((local_3b0 = pdVar15, pdVar18 = local_3b0, local_3b0 == local_398 ||
            (pdVar18 = (double_conversion *)
                       CONCAT71((int7)((ulong)local_3b0 >> 8),(char)*local_3b0 - 0x3aU),
            (byte)((char)*local_3b0 - 0x3aU) < 0xf6)))) {
          iVar8 = 6;
          if ((uVar21 & 4) == 0) {
            in_XMM0_Da = SUB84(this->junk_string_value_,0);
            in_XMM0_Db = (undefined4)((ulong)this->junk_string_value_ >> 0x20);
            iVar8 = 1;
          }
        }
        else {
          if (0x3ffffffe < iVar10 + 0x1fffffffU) {
            __assert_fail("-max_exponent / 2 <= exponent && exponent <= max_exponent / 2",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                          ,0x380,
                          "double FIX::double_conversion::StringToDoubleConverter::StringToIeee(Iterator, int, bool, int *) const [Iterator = const char *]"
                         );
          }
          iVar8 = 0;
          do {
            pdVar18 = local_3b0 + 1;
            if ((iVar8 < 0x6666666) ||
               ((iVar4 = 0x3fffffff, iVar8 == 0x6666666 && ((char)*local_3b0 < '4')))) {
              iVar4 = (int)(char)*local_3b0 + iVar8 * 10 + -0x30;
            }
            iVar8 = iVar4;
            local_3b0 = pdVar18;
          } while ((pdVar18 != local_398) && ((byte)((char)*pdVar18 - 0x30U) < 10));
          iVar4 = -iVar8;
          if (dVar7 != (double_conversion)0x2d) {
            iVar4 = iVar8;
          }
          iVar8 = 0;
          uVar11 = (ulong)(uint)(iVar4 + iVar10);
        }
        pdVar15 = local_3b0;
        if (iVar8 != 6) {
          if (iVar8 != 0) {
            return (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
          }
          goto LAB_0016beeb;
        }
      }
    }
  }
  else {
LAB_0016beeb:
    pdVar18 = (double_conversion *)((ulong)pdVar18 & 0xffffffffffffff00);
    if (local_3b0 != local_398 && (uVar21 & 0x14) == 0) {
LAB_0016bf8b:
      return this->junk_string_value_;
    }
    local_370 = uVar11;
    if ((uVar21 & 4) == 0) {
      cVar22 = local_3b0 != local_398;
      if ((bool)cVar22) {
        local_378 = (double_conversion *)CONCAT71(local_378._1_7_,cVar22);
        local_388 = local_3b0;
        local_358 = local_3b0;
        bVar6 = isWhitespace((int)(char)*local_3b0);
        pdVar18 = local_358;
        pdVar15 = local_388;
        if (bVar6) {
          pdVar18 = local_358 + 1;
          do {
            local_378 = (double_conversion *)CONCAT71(local_378._1_7_,pdVar18 != local_398);
            pdVar15 = pdVar18;
            if (pdVar18 == local_398) break;
            local_388 = pdVar18;
            bVar6 = isWhitespace((int)(char)*pdVar18);
            pdVar18 = local_388 + 1;
            pdVar15 = local_388;
          } while (bVar6);
        }
        cVar22 = (char)local_378;
        local_3b0 = pdVar15;
      }
      if (cVar22 != '\0') goto LAB_0016bf8b;
    }
    bVar6 = (uVar21 & 0x10) == 0;
    pdVar18 = (double_conversion *)
              CONCAT71((int7)((ulong)pdVar18 >> 8),local_3b0 == local_398 || bVar6);
    uVar11 = local_370;
    pdVar15 = local_3b0;
    if (local_3b0 != local_398 && !bVar6) {
      local_388 = local_3b0;
      local_378 = local_3b0;
      bVar6 = isWhitespace((int)(char)*local_3b0);
      pdVar18 = local_378;
      uVar11 = local_370;
      pdVar15 = local_388;
      if (bVar6) {
        pdVar18 = local_378 + 1;
        do {
          uVar11 = local_370;
          pdVar15 = pdVar18;
          if (pdVar18 == local_398) break;
          local_388 = pdVar18;
          bVar6 = isWhitespace((int)(char)*pdVar18);
          pdVar18 = local_388 + 1;
          uVar11 = local_370;
          pdVar15 = local_388;
        } while (bVar6);
      }
    }
  }
  goto LAB_0016ba01;
  while (uVar11 = (ulong)((int)uVar11 - 1), *local_3b0 == (double_conversion)0x30) {
LAB_0016bbf2:
    local_3b0 = local_3b0 + 1;
    if (local_3b0 == local_398) {
      *local_3a0 = (((int)pdVar15 - (int)local_390) - (int)uVar11) + 1;
      goto LAB_0016bcf4;
    }
  }
LAB_0016bc19:
  do {
    iVar8 = (int)pdVar18;
    dVar7 = *local_3b0;
    if (9 < (byte)((char)dVar7 - 0x30U)) goto LAB_0016bd8f;
    if (iVar8 < 0x304) {
      if (0x30d < (int)uVar17) {
        __assert_fail("buffer_pos < kBufferSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                      ,0x349,
                      "double FIX::double_conversion::StringToDoubleConverter::StringToIeee(Iterator, int, bool, int *) const [Iterator = const char *]"
                     );
      }
      lVar13 = (long)(int)uVar17;
      uVar17 = uVar17 + 1;
      local_348[lVar13] = dVar7;
      pdVar18 = (double_conversion *)(ulong)(iVar8 + 1);
      uVar11 = (ulong)((int)uVar11 - 1);
    }
    else {
      bVar5 = (bool)(dVar7 != (double_conversion)0x30 | bVar5);
    }
    local_3b0 = local_3b0 + 1;
    pdVar15 = local_3b0;
  } while (local_3b0 != local_398);
LAB_0016ba01:
  local_3b0 = pdVar15;
  piVar3 = local_3a0;
  if (((ulong)pdVar14 & 1) != 0) {
    local_350 = local_348;
    dVar2 = RadixStringToIeee<3,char*>
                      ((char **)&local_350,(char *)(local_348 + (int)uVar17),(bool)(char)local_3a4,
                       SUB41((uVar21 & 4) >> 2,0),this->junk_string_value_,local_368[0],&local_379);
    if (local_379 != true) {
      *local_3a0 = (int)local_3b0 - (int)local_390;
      return dVar2;
    }
    __assert_fail("!result_is_junk",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                  ,0x3a9,
                  "double FIX::double_conversion::StringToDoubleConverter::StringToIeee(Iterator, int, bool, int *) const [Iterator = const char *]"
                 );
  }
  iVar9 = (int)uVar11 + iVar9;
  if (bVar5) {
    lVar13 = (long)(int)uVar17;
    uVar17 = uVar17 + 1;
    local_348[lVar13] = (double_conversion)0x31;
    iVar9 = iVar9 + -1;
  }
  if (0x30d < (int)uVar17) {
    __assert_fail("buffer_pos < kBufferSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                  ,0x3b3,
                  "double FIX::double_conversion::StringToDoubleConverter::StringToIeee(Iterator, int, bool, int *) const [Iterator = const char *]"
                 );
  }
  local_348[(int)uVar17] = (double_conversion)0x0;
  if (local_368[0] == false) {
    if ((int)uVar17 < 0) goto LAB_0016c080;
    buffer_01.start_ = (ulong)uVar17;
    buffer_01.length_ = iVar9;
    buffer_01._12_4_ = 0;
    fVar23 = Strtof(local_348,buffer_01,(int)pdVar18);
    dVar2 = (double)fVar23;
  }
  else {
    if ((int)uVar17 < 0) {
LAB_0016c080:
      __assert_fail("len == 0 || (len > 0 && data != __null)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/utils.h"
                    ,0xb3,
                    "FIX::double_conversion::Vector<const char>::Vector(T *, int) [T = const char]")
      ;
    }
    buffer_00.start_ = (ulong)uVar17;
    buffer_00.length_ = iVar9;
    buffer_00._12_4_ = 0;
    dVar2 = Strtod(local_348,buffer_00,(int)pdVar18);
  }
  *piVar3 = (int)local_3b0 - (int)local_390;
  if ((char)local_3a4 == '\0') {
    return dVar2;
  }
  return -dVar2;
}

Assistant:

double StringToDoubleConverter::StringToIeee(
    Iterator input,
    int length,
    bool read_as_double,
    int* processed_characters_count) const {
  Iterator current = input;
  Iterator end = input + length;

  *processed_characters_count = 0;

  const bool allow_trailing_junk = (flags_ & ALLOW_TRAILING_JUNK) != 0;
  const bool allow_leading_spaces = (flags_ & ALLOW_LEADING_SPACES) != 0;
  const bool allow_trailing_spaces = (flags_ & ALLOW_TRAILING_SPACES) != 0;
  const bool allow_spaces_after_sign = (flags_ & ALLOW_SPACES_AFTER_SIGN) != 0;

  // To make sure that iterator dereferencing is valid the following
  // convention is used:
  // 1. Each '++current' statement is followed by check for equality to 'end'.
  // 2. If AdvanceToNonspace returned false then current == end.
  // 3. If 'current' becomes equal to 'end' the function returns or goes to
  // 'parsing_done'.
  // 4. 'current' is not dereferenced after the 'parsing_done' label.
  // 5. Code before 'parsing_done' may rely on 'current != end'.
  if (current == end) return empty_string_value_;

  if (allow_leading_spaces || allow_trailing_spaces) {
    if (!AdvanceToNonspace(&current, end)) {
      *processed_characters_count = static_cast<int>(current - input);
      return empty_string_value_;
    }
    if (!allow_leading_spaces && (input != current)) {
      // No leading spaces allowed, but AdvanceToNonspace moved forward.
      return junk_string_value_;
    }
  }

  // The longest form of simplified number is: "-<significant digits>.1eXXX\0".
  const int kBufferSize = kMaxSignificantDigits + 10;
  char buffer[kBufferSize];  // NOLINT: size is known at compile time.
  int buffer_pos = 0;

  // Exponent will be adjusted if insignificant digits of the integer part
  // or insignificant leading zeros of the fractional part are dropped.
  int exponent = 0;
  int significant_digits = 0;
  int insignificant_digits = 0;
  bool nonzero_digit_dropped = false;

  bool sign = false;

  if (*current == '+' || *current == '-') {
    sign = (*current == '-');
    ++current;
    Iterator next_non_space = current;
    // Skip following spaces (if allowed).
    if (!AdvanceToNonspace(&next_non_space, end)) return junk_string_value_;
    if (!allow_spaces_after_sign && (current != next_non_space)) {
      return junk_string_value_;
    }
    current = next_non_space;
  }

  if (infinity_symbol_ != NULL) {
    if (*current == infinity_symbol_[0]) {
      if (!ConsumeSubString(&current, end, infinity_symbol_)) {
        return junk_string_value_;
      }

      if (!(allow_trailing_spaces || allow_trailing_junk) && (current != end)) {
        return junk_string_value_;
      }
      if (!allow_trailing_junk && AdvanceToNonspace(&current, end)) {
        return junk_string_value_;
      }

      ASSERT(buffer_pos == 0);
      *processed_characters_count = static_cast<int>(current - input);
      return sign ? -Double::Infinity() : Double::Infinity();
    }
  }

  if (nan_symbol_ != NULL) {
    if (*current == nan_symbol_[0]) {
      if (!ConsumeSubString(&current, end, nan_symbol_)) {
        return junk_string_value_;
      }

      if (!(allow_trailing_spaces || allow_trailing_junk) && (current != end)) {
        return junk_string_value_;
      }
      if (!allow_trailing_junk && AdvanceToNonspace(&current, end)) {
        return junk_string_value_;
      }

      ASSERT(buffer_pos == 0);
      *processed_characters_count = static_cast<int>(current - input);
      return sign ? -Double::NaN() : Double::NaN();
    }
  }

  bool leading_zero = false;
  if (*current == '0') {
    ++current;
    if (current == end) {
      *processed_characters_count = static_cast<int>(current - input);
      return SignedZero(sign);
    }

    leading_zero = true;

    // It could be hexadecimal value.
    if ((flags_ & ALLOW_HEX) && (*current == 'x' || *current == 'X')) {
      ++current;
      if (current == end || !isDigit(*current, 16)) {
        return junk_string_value_;  // "0x".
      }

      bool result_is_junk;
      double result = RadixStringToIeee<4>(&current,
                                           end,
                                           sign,
                                           allow_trailing_junk,
                                           junk_string_value_,
                                           read_as_double,
                                           &result_is_junk);
      if (!result_is_junk) {
        if (allow_trailing_spaces) AdvanceToNonspace(&current, end);
        *processed_characters_count = static_cast<int>(current - input);
      }
      return result;
    }

    // Ignore leading zeros in the integer part.
    while (*current == '0') {
      ++current;
      if (current == end) {
        *processed_characters_count = static_cast<int>(current - input);
        return SignedZero(sign);
      }
    }
  }

  bool octal = leading_zero && (flags_ & ALLOW_OCTALS) != 0;

  // Copy significant digits of the integer part (if any) to the buffer.
  while (*current >= '0' && *current <= '9') {
    if (significant_digits < kMaxSignificantDigits) {
      ASSERT(buffer_pos < kBufferSize);
      buffer[buffer_pos++] = static_cast<char>(*current);
      significant_digits++;
      // Will later check if it's an octal in the buffer.
    } else {
      insignificant_digits++;  // Move the digit into the exponential part.
      nonzero_digit_dropped = nonzero_digit_dropped || *current != '0';
    }
    octal = octal && *current < '8';
    ++current;
    if (current == end) goto parsing_done;
  }

  if (significant_digits == 0) {
    octal = false;
  }

  if (*current == '.') {
    if (octal && !allow_trailing_junk) return junk_string_value_;
    if (octal) goto parsing_done;

    ++current;
    if (current == end) {
      if (significant_digits == 0 && !leading_zero) {
        return junk_string_value_;
      } else {
        goto parsing_done;
      }
    }

    if (significant_digits == 0) {
      // octal = false;
      // Integer part consists of 0 or is absent. Significant digits start after
      // leading zeros (if any).
      while (*current == '0') {
        ++current;
        if (current == end) {
          *processed_characters_count = static_cast<int>(current - input);
          return SignedZero(sign);
        }
        exponent--;  // Move this 0 into the exponent.
      }
    }

    // There is a fractional part.
    // We don't emit a '.', but adjust the exponent instead.
    while (*current >= '0' && *current <= '9') {
      if (significant_digits < kMaxSignificantDigits) {
        ASSERT(buffer_pos < kBufferSize);
        buffer[buffer_pos++] = static_cast<char>(*current);
        significant_digits++;
        exponent--;
      } else {
        // Ignore insignificant digits in the fractional part.
        nonzero_digit_dropped = nonzero_digit_dropped || *current != '0';
      }
      ++current;
      if (current == end) goto parsing_done;
    }
  }

  if (!leading_zero && exponent == 0 && significant_digits == 0) {
    // If leading_zeros is true then the string contains zeros.
    // If exponent < 0 then string was [+-]\.0*...
    // If significant_digits != 0 the string is not equal to 0.
    // Otherwise there are no digits in the string.
    return junk_string_value_;
  }

  // Parse exponential part.
  if (*current == 'e' || *current == 'E') {
    if (octal && !allow_trailing_junk) return junk_string_value_;
    if (octal) goto parsing_done;
    ++current;
    if (current == end) {
      if (allow_trailing_junk) {
        goto parsing_done;
      } else {
        return junk_string_value_;
      }
    }
    char exponen_sign = '+';
    if (*current == '+' || *current == '-') {
      exponen_sign = static_cast<char>(*current);
      ++current;
      if (current == end) {
        if (allow_trailing_junk) {
          goto parsing_done;
        } else {
          return junk_string_value_;
        }
      }
    }

    if (current == end || *current < '0' || *current > '9') {
      if (allow_trailing_junk) {
        goto parsing_done;
      } else {
        return junk_string_value_;
      }
    }

    const int max_exponent = INT_MAX / 2;
    ASSERT(-max_exponent / 2 <= exponent && exponent <= max_exponent / 2);
    int num = 0;
    do {
      // Check overflow.
      int digit = *current - '0';
      if (num >= max_exponent / 10
          && !(num == max_exponent / 10 && digit <= max_exponent % 10)) {
        num = max_exponent;
      } else {
        num = num * 10 + digit;
      }
      ++current;
    } while (current != end && *current >= '0' && *current <= '9');

    exponent += (exponen_sign == '-' ? -num : num);
  }

  if (!(allow_trailing_spaces || allow_trailing_junk) && (current != end)) {
    return junk_string_value_;
  }
  if (!allow_trailing_junk && AdvanceToNonspace(&current, end)) {
    return junk_string_value_;
  }
  if (allow_trailing_spaces) {
    AdvanceToNonspace(&current, end);
  }

  parsing_done:
  exponent += insignificant_digits;

  if (octal) {
    double result;
    bool result_is_junk;
    char* start = buffer;
    result = RadixStringToIeee<3>(&start,
                                  buffer + buffer_pos,
                                  sign,
                                  allow_trailing_junk,
                                  junk_string_value_,
                                  read_as_double,
                                  &result_is_junk);
    ASSERT(!result_is_junk);
    *processed_characters_count = static_cast<int>(current - input);
    return result;
  }

  if (nonzero_digit_dropped) {
    buffer[buffer_pos++] = '1';
    exponent--;
  }

  ASSERT(buffer_pos < kBufferSize);
  buffer[buffer_pos] = '\0';

  double converted;
  if (read_as_double) {
    converted = Strtod(Vector<const char>(buffer, buffer_pos), exponent);
  } else {
    converted = Strtof(Vector<const char>(buffer, buffer_pos), exponent);
  }
  *processed_characters_count = static_cast<int>(current - input);
  return sign? -converted: converted;
}